

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_retry_request(connectdata *conn,char **url)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  char *pcVar3;
  HTTP *http;
  Curl_easy *data;
  char **url_local;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  *url = (char *)0x0;
  if ((((pCVar1->set).upload & 1U) != 0) && ((conn->handler->protocol & 0x40003) == 0)) {
    return CURLE_OK;
  }
  if ((((pCVar1->req).bytecount + (pCVar1->req).headerbytecount == 0) &&
      (((conn->bits).reuse & 1U) != 0)) && ((pCVar1->set).rtspreq != RTSPREQ_RECEIVE)) {
    Curl_infof(conn->data,"Connection died, retrying a fresh connect\n");
    pcVar3 = (*Curl_cstrdup)((conn->data->change).url);
    *url = pcVar3;
    if (*url == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->bits).close = true;
    (conn->bits).retry = true;
    if (((conn->handler->protocol & 3) != 0) && (*(long *)((long)(pCVar1->req).protop + 0x30) != 0))
    {
      CVar2 = Curl_readrewind(conn);
      return CVar2;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_retry_request(struct connectdata *conn,
                            char **url)
{
  struct Curl_easy *data = conn->data;

  *url = NULL;

  /* if we're talking upload, we can't do the checks below, unless the protocol
     is HTTP as when uploading over HTTP we will still get a response */
  if(data->set.upload &&
     !(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)))
    return CURLE_OK;

  if((data->req.bytecount + data->req.headerbytecount == 0) &&
     conn->bits.reuse &&
     (data->set.rtspreq != RTSPREQ_RECEIVE)) {
    /* We didn't get a single byte when we attempted to re-use a
       connection. This might happen if the connection was left alive when we
       were done using it before, but that was closed when we wanted to use it
       again. Bad luck. Retry the same request on a fresh connect! */
    infof(conn->data, "Connection died, retrying a fresh connect\n");
    *url = strdup(conn->data->change.url);
    if(!*url)
      return CURLE_OUT_OF_MEMORY;

    connclose(conn, "retry"); /* close this connection */
    conn->bits.retry = TRUE; /* mark this as a connection we're about
                                to retry. Marking it this way should
                                prevent i.e HTTP transfers to return
                                error just because nothing has been
                                transferred! */


    if(conn->handler->protocol&PROTO_FAMILY_HTTP) {
      struct HTTP *http = data->req.protop;
      if(http->writebytecount)
        return Curl_readrewind(conn);
    }
  }
  return CURLE_OK;
}